

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void first_pass_intra_pred_and_calc_diff
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  TX_SIZE tx_size_00;
  int in_EDI;
  undefined8 *in_stack_00000008;
  TX_SIZE in_stack_0000002f;
  int in_stack_00000030;
  int in_stack_00000034;
  int in_stack_00000038;
  BLOCK_SIZE in_stack_0000003f;
  MACROBLOCKD *in_stack_00000040;
  uint8_t *src;
  int src_stride;
  SequenceHeader *seq_params;
  MB_MODE_INFO *mbmi;
  uint8_t *dst;
  int in_stack_00000090;
  int dst_stride;
  MACROBLOCK_PLANE *p;
  MACROBLOCKD_PLANE *pd;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  intra_pred_block_pass1_args *args;
  int in_stack_000000c0;
  BLOCK_SIZE in_stack_ffffffffffffff6b;
  int plane_00;
  MACROBLOCK *x_00;
  
  tx_size_00 = (TX_SIZE)((uint)in_ESI >> 0x18);
  lVar1 = in_stack_00000008[1] + (long)in_EDI * 0x88;
  x_00 = (MACROBLOCK *)*in_stack_00000008;
  plane_00 = *(int *)(lVar1 + 0x48);
  lVar1 = *(long *)(lVar1 + 0x30) + (long)((in_EDX * plane_00 + in_ECX) * 4);
  av1_predict_intra_block
            (in_stack_00000040,in_stack_0000003f,in_stack_00000038,in_stack_00000034,
             in_stack_00000030,in_stack_0000002f,(PREDICTION_MODE)mbmi,(int)dst,in_stack_00000090,
             (FILTER_INTRA_MODE)p,&pd->plane_type,(int)xd,(uint8_t *)x,(int)args,in_stack_000000c0,
             blk_col,block);
  av1_subtract_txb(x_00,plane_00,in_stack_ffffffffffffff6b,(int)((ulong)lVar1 >> 0x20),(int)lVar1,
                   tx_size_00);
  return;
}

Assistant:

static void first_pass_intra_pred_and_calc_diff(int plane, int block,
                                                int blk_row, int blk_col,
                                                BLOCK_SIZE plane_bsize,
                                                TX_SIZE tx_size, void *arg) {
  (void)block;
  struct intra_pred_block_pass1_args *const args = arg;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  MACROBLOCKD_PLANE *const pd = &xd->plane[plane];
  MACROBLOCK_PLANE *const p = &x->plane[plane];
  const int dst_stride = pd->dst.stride;
  uint8_t *dst = &pd->dst.buf[(blk_row * dst_stride + blk_col) << MI_SIZE_LOG2];
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const SequenceHeader *seq_params = args->seq_params;
  const int src_stride = p->src.stride;
  uint8_t *src = &p->src.buf[(blk_row * src_stride + blk_col) << MI_SIZE_LOG2];

  av1_predict_intra_block(
      xd, seq_params->sb_size, seq_params->enable_intra_edge_filter, pd->width,
      pd->height, tx_size, mbmi->mode, 0, 0, FILTER_INTRA_MODES, src,
      src_stride, dst, dst_stride, blk_col, blk_row, plane);

  av1_subtract_txb(x, plane, plane_bsize, blk_col, blk_row, tx_size);
}